

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_db.c
# Opt level: O0

nhdp_l2hop * nhdp_db_link_2hop_add(nhdp_link *lnk,netaddr *addr)

{
  nhdp_interface *pnVar1;
  nhdp_l2hop *l2hop;
  netaddr *addr_local;
  nhdp_link *lnk_local;
  
  lnk_local = (nhdp_link *)oonf_class_malloc(&_l2hop_info);
  if (lnk_local == (nhdp_link *)0x0) {
    lnk_local = (nhdp_link *)0x0;
  }
  else {
    *(undefined8 *)((netaddr *)&lnk_local->vtime_value)->_addr = *(undefined8 *)addr->_addr;
    lnk_local->itime_value = *(uint64_t *)(addr->_addr + 8);
    *(undefined2 *)&(lnk_local->sym_time)._node.list.next = *(undefined2 *)&addr->_type;
    (lnk_local->heard_time).class = (oonf_timer_class *)lnk_local;
    (lnk_local->sym_time)._node.list.prev = (list_entity *)lnk;
    (lnk_local->sym_time)._period = (uint64_t)&_l2hop_vtime_info;
    avl_insert(&lnk->_2hop,&(lnk_local->heard_time)._node.parent);
    pnVar1 = lnk->local_if;
    (lnk_local->vtime)._node.parent = (avl_node *)lnk_local;
    avl_insert(&pnVar1->_if_twohops,&(lnk_local->heard_time)._period);
    nhdp_domain_init_l2hop((nhdp_l2hop *)lnk_local);
    oonf_class_event(&_l2hop_info,lnk_local,1);
  }
  return (nhdp_l2hop *)lnk_local;
}

Assistant:

struct nhdp_l2hop *
nhdp_db_link_2hop_add(struct nhdp_link *lnk, const struct netaddr *addr) {
  struct nhdp_l2hop *l2hop;

  l2hop = oonf_class_malloc(&_l2hop_info);
  if (l2hop == NULL) {
    return NULL;
  }

  /* initialize key */
  memcpy(&l2hop->twohop_addr, addr, sizeof(l2hop->twohop_addr));
  l2hop->_link_node.key = &l2hop->twohop_addr;

  /* initialize back link */
  l2hop->link = lnk;

  /* initialize validity timer */
  l2hop->_vtime.class = &_l2hop_vtime_info;

  /* add to link tree */
  avl_insert(&lnk->_2hop, &l2hop->_link_node);

  /* add to interface tree */
  nhdp_interface_add_l2hop(lnk->local_if, l2hop);

  /* initialize metrics */
  nhdp_domain_init_l2hop(l2hop);

  /* trigger event */
  oonf_class_event(&_l2hop_info, l2hop, OONF_OBJECT_ADDED);

  return l2hop;
}